

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O3

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 *extraout_RDX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 local_18;
  long local_10;
  
  iVar2 = (int)&local_18;
  local_10 = (long)status;
  local_18 = 0;
  if (local_10 == 0) {
    iVar1 = uv_tcp_init(server->loop,&connection);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001ce6fb;
    iVar1 = uv_accept(server,&connection);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 == 0) {
      iVar1 = uv_read_start(&connection,on_alloc,on_read1);
      local_10 = (long)iVar1;
      local_18 = 0;
      if (local_10 == 0) {
        return;
      }
      goto LAB_001ce715;
    }
  }
  else {
    on_connection_cold_1();
LAB_001ce6fb:
    on_connection_cold_2();
  }
  on_connection_cold_3();
LAB_001ce715:
  on_connection_cold_4();
  if (iVar2 == 0) {
    do_write((uv_stream_t *)&client,on_write_close_immediately);
    return;
  }
  on_connect_cold_1();
  *extraout_RDX = on_alloc::slab;
  extraout_RDX[1] = 0x10000;
  return;
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  uv_tcp_t* handle;
  int r;

  ASSERT_OK(status);

  handle = malloc(sizeof(*handle));
  ASSERT_NOT_NULL(handle);

  r = uv_tcp_init_ex(server->loop, handle, AF_INET);
  ASSERT_OK(r);

  r = uv_accept(server, (uv_stream_t*)handle);
  ASSERT_EQ(r, UV_EBUSY);

  uv_close((uv_handle_t*) server, NULL);
  uv_close((uv_handle_t*) handle, (uv_close_cb)free);
}